

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<bool> __thiscall
kj::HttpServer::listenHttpCleanDrain(HttpServer *this,AsyncIoStream *connection)

{
  int iVar1;
  Response *pRVar2;
  Response *pRVar3;
  Connection *pCVar4;
  undefined8 uVar5;
  HttpService *pHVar6;
  PromiseNode *pPVar7;
  Connection *pCVar8;
  undefined8 *puVar9;
  TransformPromiseNodeBase *this_00;
  AsyncIoStream *in_RDX;
  EagerPromiseNode<bool> *pEVar10;
  EagerPromiseNode<bool> *extraout_RDX;
  EagerPromiseNode<bool> *extraout_RDX_00;
  EagerPromiseNode<bool> *extraout_RDX_01;
  Own<kj::HttpServer::Connection> OVar11;
  Promise<bool> PVar12;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar13;
  Own<kj::_::EagerPromiseNode<bool>_> OVar14;
  Own<kj::HttpService> srv;
  Own<kj::HttpServer::Connection> obj;
  Promise<bool> promise;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  Connection *pCStack_60;
  Own<kj::HttpServer::Connection> local_58;
  undefined1 local_48 [24];
  HttpService *local_30;
  Own<kj::_::PromiseNode> local_28;
  
  local_68 = (undefined8 *)0x0;
  pCStack_60 = (Connection *)0x0;
  iVar1 = *(int *)&connection[1].super_AsyncOutputStream._vptr_AsyncOutputStream;
  if (iVar1 == 2) {
    (**(code **)*connection[2].super_AsyncOutputStream._vptr_AsyncOutputStream)(&local_78);
    OVar11 = heap<kj::HttpServer::Connection,kj::HttpServer&,kj::AsyncIoStream&,kj::HttpService&>
                       ((kj *)&local_58,(HttpServer *)connection,in_RDX,(HttpService *)uStack_70);
    puVar9 = local_68;
    local_68 = (undefined8 *)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_);
    pCVar8 = local_58.ptr;
    local_58.ptr = (Connection *)0x0;
    if (pCStack_60 != (Connection *)0x0) {
      pRVar2 = &pCStack_60->super_Response;
      pRVar3 = &pCStack_60->super_Response;
      pCStack_60 = pCVar8;
      (**(code **)*puVar9)(puVar9,pRVar2->_vptr_Response[-2] + (long)pRVar3,OVar11.ptr);
      pCVar8 = pCStack_60;
    }
    pCStack_60 = pCVar8;
    pCVar8 = local_58.ptr;
    if (local_58.ptr != (Connection *)0x0) {
      local_58.ptr = (Connection *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_))
                ((undefined8 *)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_),
                 (pCVar8->super_Response)._vptr_Response[-2] + (long)&pCVar8->super_Response);
    }
    puVar9 = (undefined8 *)operator_new(0x28);
    *puVar9 = &PTR___cxa_pure_virtual_00453a18;
    puVar9[1] = CONCAT44(uStack_74,local_78);
    puVar9[2] = uStack_70;
    uStack_70 = (Connection *)0x0;
    puVar9[3] = local_68;
    puVar9[4] = pCStack_60;
    *puVar9 = &PTR_disposeImpl_00465358;
    local_68 = puVar9;
    pCVar8 = (Connection *)0x1;
    if (pCStack_60 != (Connection *)0x0) {
      pCVar8 = pCStack_60;
    }
  }
  else {
    pCVar8 = pCStack_60;
    if (iVar1 == 1) {
      OVar11 = heap<kj::HttpServer::Connection,kj::HttpServer&,kj::AsyncIoStream&,kj::HttpService&>
                         ((kj *)&local_78,(HttpServer *)connection,in_RDX,
                          (HttpService *)connection[2].super_AsyncInputStream._vptr_AsyncInputStream
                         );
      puVar9 = local_68;
      local_68 = (undefined8 *)CONCAT44(uStack_74,local_78);
      pCVar8 = uStack_70;
      uStack_70 = (Connection *)0x0;
      if (pCStack_60 != (Connection *)0x0) {
        pRVar2 = &pCStack_60->super_Response;
        pRVar3 = &pCStack_60->super_Response;
        pCStack_60 = pCVar8;
        (**(code **)*puVar9)(puVar9,pRVar2->_vptr_Response[-2] + (long)pRVar3,OVar11.ptr);
        pCVar8 = pCStack_60;
      }
      pCStack_60 = pCVar8;
      pCVar4 = uStack_70;
      pCVar8 = pCStack_60;
      if (uStack_70 != (Connection *)0x0) {
        uStack_70 = (Connection *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_74,local_78))
                  ((undefined8 *)CONCAT44(uStack_74,local_78),
                   (pCVar4->super_Response)._vptr_Response[-2] + (long)&pCVar4->super_Response);
        pCVar8 = pCStack_60;
      }
    }
  }
  pCStack_60 = pCVar8;
  PVar12 = Connection::loop((Connection *)local_48,SUB81(pCStack_60,0));
  (*(in_RDX->super_AsyncOutputStream)._vptr_AsyncOutputStream[3])
            (local_48 + 0x10,&in_RDX->super_AsyncOutputStream,PVar12.super_PromiseBase.node.ptr);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)(local_48 + 0x10),
             _::
             TransformPromiseNode<bool,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:5102:62),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00463ac0;
  local_28.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<bool,kj::_::Void,kj::HttpServer::listenHttpCleanDrain(kj::AsyncIoStream&)::$_0,kj::_::PropagateException>>
        ::instance;
  local_28.ptr = (PromiseNode *)this_00;
  OVar13 = heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_78,(Own<kj::_::PromiseNode> *)local_48,&local_28);
  pPVar7 = local_28.ptr;
  local_58.disposer._0_4_ = local_78;
  local_58.disposer._4_4_ = uStack_74;
  local_58.ptr = uStack_70;
  if ((TransformPromiseNodeBase *)local_28.ptr != (TransformPromiseNodeBase *)0x0) {
    local_28.ptr = (PromiseNode *)0x0;
    (**(code **)*(_func_int **)local_28.disposer)
              (local_28.disposer,
               ((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode,OVar13.ptr);
  }
  pHVar6 = local_30;
  if (local_30 != (HttpService *)0x0) {
    local_30 = (HttpService *)0x0;
    (**((AsyncInputStream *)local_48._16_8_)->_vptr_AsyncInputStream)
              (local_48._16_8_,pHVar6->_vptr_HttpService[-2] + (long)&pHVar6->_vptr_HttpService);
  }
  uVar5 = local_48._8_8_;
  if ((HttpServer *)local_48._8_8_ != (HttpServer *)0x0) {
    local_48._8_8_ = (HttpServer *)0x0;
    (**(code **)*(_func_int **)local_48._0_8_)
              (local_48._0_8_,
               ((ErrorHandler *)uVar5)->_vptr_ErrorHandler[-2] +
               (long)&((ErrorHandler *)uVar5)->_vptr_ErrorHandler);
  }
  Promise<bool>::attach<kj::Own<kj::HttpServer::Connection>>((Promise<bool> *)local_48,&local_58);
  OVar14 = heap<kj::_::EagerPromiseNode<bool>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_78,(Own<kj::_::PromiseNode> *)local_48);
  uVar5 = local_48._8_8_;
  pEVar10 = OVar14.ptr;
  *(undefined4 *)&(this->super_ErrorHandler)._vptr_ErrorHandler = local_78;
  *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) = uStack_74;
  *(undefined4 *)&this->timer = (undefined4)uStack_70;
  *(undefined4 *)((long)&this->timer + 4) = uStack_70._4_4_;
  if ((HttpServer *)local_48._8_8_ != (HttpServer *)0x0) {
    local_48._8_8_ = (HttpServer *)0x0;
    (**(code **)*(_func_int **)local_48._0_8_)
              (local_48._0_8_,
               ((ErrorHandler *)uVar5)->_vptr_ErrorHandler[-2] +
               (long)&((ErrorHandler *)uVar5)->_vptr_ErrorHandler);
    pEVar10 = extraout_RDX;
  }
  pCVar8 = local_58.ptr;
  if (local_58.ptr != (Connection *)0x0) {
    local_58.ptr = (Connection *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_),
               (pCVar8->super_Response)._vptr_Response[-2] + (long)&pCVar8->super_Response);
    pEVar10 = extraout_RDX_00;
  }
  pCVar8 = pCStack_60;
  if (pCStack_60 != (Connection *)0x0) {
    pCStack_60 = (Connection *)0x0;
    (**(code **)*local_68)
              (local_68,(pCVar8->super_Response)._vptr_Response[-2] + (long)&pCVar8->super_Response)
    ;
    pEVar10 = extraout_RDX_01;
  }
  PVar12.super_PromiseBase.node.ptr = (PromiseNode *)pEVar10;
  PVar12.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<bool>)PVar12.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> HttpServer::listenHttpCleanDrain(kj::AsyncIoStream& connection) {
  kj::Own<Connection> obj;

  KJ_SWITCH_ONEOF(service) {
    KJ_CASE_ONEOF(ptr, HttpService*) {
      obj = heap<Connection>(*this, connection, *ptr);
    }
    KJ_CASE_ONEOF(func, HttpServiceFactory) {
      auto srv = func(connection);
      obj = heap<Connection>(*this, connection, *srv);
      obj = obj.attach(kj::mv(srv));
    }
  }

  // Start reading requests and responding to them, but immediately cancel processing if the client
  // disconnects.
  auto promise = obj->loop(true)
      .exclusiveJoin(connection.whenWriteDisconnected().then([]() {return false;}));

  // Eagerly evaluate so that we drop the connection when the promise resolves, even if the caller
  // doesn't eagerly evaluate.
  return promise.attach(kj::mv(obj)).eagerlyEvaluate(nullptr);
}